

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O2

int testStorageWriterTestsSupportedTypes(void)

{
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  char *pcVar5;
  SpanSize<18446744073709551615UL> in_R8;
  uchar *__first1;
  pointer ptVar6;
  SpanSize<18446744073709551615UL> __n;
  pointer ptVar7;
  uchar *__first2;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  initializer_list<MILBlob::Fp16> __l_00;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> data_00;
  Span<unsigned_char,_18446744073709551615UL> data_01;
  allocator_type local_e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  StorageWriter writer;
  uint64_t uStack_b0;
  byte local_a8;
  undefined7 uStack_a7;
  string filePath;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  std::__cxx11::string::string((string *)&filePath,(string *)psVar2);
  writer.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl._0_4_ =
       0x10adde01;
  __l._M_len = 4;
  __l._M_array = (iterator)&writer;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&val,__l,(allocator_type *)&output);
  __n.m_size = (long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  __first2 = (uchar *)0x0;
  if (__n.m_size != 0) {
    __first2 = val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::StorageWriter::StorageWriter(&writer,psVar2,true);
  data.m_size.m_size = __n.m_size;
  data.m_ptr = __first2;
  uVar3 = MILBlob::Blob::StorageWriter::WriteData<unsigned_char>(&writer,data);
  MILBlob::Blob::StorageWriter::~StorageWriter(&writer);
  if ((uVar3 & 0x3f) == 0) {
    bVar1 = anon_unknown.dwarf_f3c07::IsCorrectHeader(&filePath,1);
    if (bVar1) {
      writer.m_impl._M_t.
      super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl._0_4_ =
           0xdeadbeef;
      MILBlob::TestUtil::ReadData<MILBlob::Blob::blob_metadata>
                (&filePath,(blob_metadata *)&writer,uVar3);
      if (((((int)writer.m_impl._M_t.
                  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl
             == -0x21524111) &&
           (writer.m_impl._M_t.
            super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl._4_4_
            == 3)) && (uStack_b0 == 4)) && ((local_a8 & 0x3f) == 0)) {
        writer.m_impl._M_t.
        super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
             (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
              )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
                )0x3deadbeef;
        MILBlob::TestUtil::ReadData<MILBlob::Blob::blob_metadata>
                  (&filePath,(blob_metadata *)&writer,uVar3);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&output,__n.m_size,&local_e9);
        ptVar6 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 -(long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        __first1 = (uchar *)0x0;
        if (ptVar6 != (pointer)0x0) {
          __first1 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
        data_01.m_size.m_size = in_R8.m_size;
        data_01.m_ptr = ptVar6;
        MILBlob::TestUtil::ReadBlobFile<unsigned_char>
                  ((TestUtil *)&filePath,(string *)CONCAT71(uStack_a7,local_a8),(uint64_t)__first1,
                   data_01);
        if (ptVar6 == (pointer)__n.m_size) {
          bVar1 = std::__equal<true>::equal<unsigned_char>(__first1,__first1 + __n.m_size,__first2);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          if (bVar1) {
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            writer.m_impl._M_t.
            super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
                 (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                  )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
                    )0xabcd012400000012;
            __l_00._M_len = 4;
            __l_00._M_array = (iterator)&writer;
            std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
                      ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)&val,__l_00,
                       (allocator_type *)&output);
            ptVar7 = (pointer)0x0;
            if ((long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != 0) {
              ptVar7 = (pointer)val.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            }
            psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
            MILBlob::Blob::StorageWriter::StorageWriter(&writer,psVar2,false);
            data_00.m_size.m_size =
                 (long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start >> 1;
            data_00.m_ptr = ptVar7;
            uVar3 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::Fp16>(&writer,data_00);
            MILBlob::Blob::StorageWriter::~StorageWriter(&writer);
            if ((uVar3 & 0x3f) == 0) {
              bVar1 = anon_unknown.dwarf_f3c07::IsCorrectHeader(&filePath,2);
              if (bVar1) {
                writer.m_impl._M_t.
                super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl.
                _0_4_ = 0xdeadbeef;
                MILBlob::TestUtil::ReadData<MILBlob::Blob::blob_metadata>
                          (&filePath,(blob_metadata *)&writer,uVar3);
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5d);
                poVar4 = std::operator<<(poVar4,": error: ");
                pcVar5 = "IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16)";
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5c);
                poVar4 = std::operator<<(poVar4,": error: ");
                pcVar5 = "IsCorrectHeader(filePath, 2 )";
              }
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5b);
              poVar4 = std::operator<<(poVar4,": error: ");
              pcVar5 = "(offset % DefaultStorageAlignment) == (uint64_t(0))";
            }
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::endl<char,std::char_traits<char>>(poVar4);
            std::_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::~_Vector_base
                      ((_Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)&val);
            goto LAB_0017b0ae;
          }
        }
        else {
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4e);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar5 = "IsCorrectData<uint8_t>(filePath, offset, expectedSpan)";
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4d);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar5 = "IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8)";
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4c);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar5 = "IsCorrectHeader(filePath, 1 )";
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4b);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar5 = "(offset % DefaultStorageAlignment) == (uint64_t(0))";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_0017b0ae:
  std::__cxx11::string::~string((string *)&filePath);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testStorageWriterTestsSupportedTypes()
{
    AutoDeleteTempFile tempfile;
    auto filePath = tempfile.GetFilename();

    // Writing uint8_t values
    {
        const std::vector<uint8_t> val = {0x01, 0xde, 0xad, 0x10};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename());
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 1 /*count*/));
        ML_ASSERT(IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8));
        ML_ASSERT(IsCorrectData<uint8_t>(filePath, offset, expectedSpan));
    }

    // Writing fp16 values
    {
        const std::vector<Fp16> val = {Fp16(0x12), Fp16(0x00), Fp16(0x124), Fp16(0xabcd)};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 2 /*count*/));
        ML_ASSERT(IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16));
        ML_ASSERT(IsCorrectData<Fp16>(filePath, offset, expectedSpan));
    }

    // Writing fp32 values
    {
        const std::vector<float> val = {3.14f, 72.1535155f, 0xabcde, 0x007};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 3 /*count*/));
        ML_ASSERT(IsCorrectMetadata<float>(filePath, offset, 4, BlobDataType::Float32));
        ML_ASSERT(IsCorrectData<float>(filePath, offset, expectedSpan));
    }

    // Writing int8 values
    {
        const std::vector<int8_t> val = {1, -1, 10, -25};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 4 /*count*/));
        ML_ASSERT(IsCorrectMetadata<int8_t>(filePath, offset, 4, BlobDataType::Int8));
        ML_ASSERT(IsCorrectData<int8_t>(filePath, offset, expectedSpan));
    }

    return 0;
}